

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O1

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,AssignmentStatement *statement)

{
  Lvalue *pLVar1;
  pointer pcVar2;
  VariableValue *this_00;
  FieldAccess *pFVar3;
  int iVar4;
  int iVar5;
  Value *value;
  Value *pVVar6;
  ArrayValue *this_01;
  _Alloc_hider _Var7;
  string local_130;
  Symbol local_110;
  string local_f0;
  Symbol local_d0;
  string local_b0;
  Symbol local_90;
  string local_70;
  Symbol local_50;
  
  value = TemplateVisitor<Value_*>::Accept
                    (&this->super_TemplateVisitor<Value_*>,&statement->expression_->super_Node);
  pLVar1 = statement->lvalue_;
  if (pLVar1->code_ == 2) {
    pcVar2 = (pLVar1->field_access_->field_name_)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,
               pcVar2 + (pLVar1->field_access_->field_name_)._M_string_length);
    Symbol::Symbol(&local_90,&local_b0);
    iVar4 = FunctionTable::Get(&this->table_,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name_._M_dataplus._M_p != &local_90.name_.field_2) {
      operator_delete(local_90.name_._M_dataplus._M_p,
                      local_90.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    this_00 = this->this_;
    pFVar3 = statement->lvalue_->field_access_;
    pcVar2 = (pFVar3->field_name_)._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + (pFVar3->field_name_)._M_string_length);
    Symbol::Symbol(&local_d0,&local_f0);
    VariableValue::SetField(this_00,&local_d0,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.name_._M_dataplus._M_p != &local_d0.name_.field_2) {
      operator_delete(local_d0.name_._M_dataplus._M_p,
                      local_d0.name_.field_2._M_allocated_capacity + 1);
    }
    _Var7._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0011cff7;
  }
  else {
    if (pLVar1->code_ == 1) {
      pcVar2 = (pLVar1->array_access_expression_->array_indent_)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,
                 pcVar2 + (pLVar1->array_access_expression_->array_indent_)._M_string_length);
      Symbol::Symbol(&local_50,&local_70);
      iVar4 = FunctionTable::Get(&this->table_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.name_._M_dataplus._M_p != &local_50.name_.field_2) {
        operator_delete(local_50.name_._M_dataplus._M_p,
                        local_50.name_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pVVar6 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,
                          &statement->lvalue_->array_access_expression_->index_expression_->
                           super_Node);
      iVar5 = (*pVVar6->_vptr_Value[2])(pVVar6);
      pVVar6 = FrameEmulator::Get(&this->frame_,iVar4);
      this_01 = (ArrayValue *)__dynamic_cast(pVVar6,&Value::typeinfo,&ArrayValue::typeinfo,0);
      ArrayValue::SetAtIndex(this_01,value,(long)iVar5);
      return;
    }
    pcVar2 = (pLVar1->variable_name_)._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,pcVar2 + (pLVar1->variable_name_)._M_string_length);
    Symbol::Symbol(&local_110,&local_130);
    iVar4 = FunctionTable::Get(&this->table_,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.name_._M_dataplus._M_p != &local_110.name_.field_2) {
      operator_delete(local_110.name_._M_dataplus._M_p,
                      local_110.name_.field_2._M_allocated_capacity + 1);
    }
    local_f0.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
    _Var7._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_0011cff7;
  }
  operator_delete(_Var7._M_p,local_f0.field_2._M_allocated_capacity + 1);
LAB_0011cff7:
  FrameEmulator::Set(&this->frame_,iVar4,value);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(AssignmentStatement* statement) {
  auto value = Accept(statement->expression_);
  if (statement->lvalue_->code_ == Lvalue::CODE::ARR) {
    int index = table_.Get(
        Symbol(statement->lvalue_->array_access_expression_->array_indent_));
    int array_index =
        Accept(statement->lvalue_->array_access_expression_->index_expression_)
            ->GetValue();

    dynamic_cast<ArrayValue*>(frame_.Get(index))
        ->SetAtIndex(value, array_index);
  } else if (statement->lvalue_->code_ == Lvalue::CODE::FIELD) {
    int index =
        table_.Get(Symbol(statement->lvalue_->field_access_->field_name_));

    this_->SetField(Symbol(statement->lvalue_->field_access_->field_name_),
                    value);

    frame_.Set(index, value);
  } else {
    int index = table_.Get(Symbol(statement->lvalue_->variable_name_));

    frame_.Set(index, value);
  }
}